

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.cpp
# Opt level: O2

void __thiscall
charls::jpeg_stream_writer::write_start_of_scan_segment
          (jpeg_stream_writer *this,int32_t component_count,int32_t near_lossless,
          interleave_mode interleave_mode)

{
  bool bVar1;
  
  if (component_count - 0x100U < 0xffffff01) {
    __assert_fail("component_count > 0 && component_count <= numeric_limits<uint8_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.cpp"
                  ,0xaf,
                  "void charls::jpeg_stream_writer::write_start_of_scan_segment(const int32_t, const int32_t, const interleave_mode)"
                 );
  }
  if ((uint)near_lossless < 0x100) {
    if (interleave_mode < (Sample|Line)) {
      write_segment_header(this,start_of_scan,(ulong)(component_count * 2 + 4));
      write_uint8(this,component_count);
      while (bVar1 = component_count != 0, component_count = component_count + -1, bVar1) {
        write_uint8(this,this->component_id_);
        write_uint8(this,'\0');
        this->component_id_ = this->component_id_ + '\x01';
      }
      write_uint8(this,near_lossless);
      write_uint8(this,interleave_mode);
      write_uint8(this,'\0');
      return;
    }
    __assert_fail("interleave_mode == interleave_mode::none || interleave_mode == interleave_mode::line || interleave_mode == interleave_mode::sample"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.cpp"
                  ,0xb2,
                  "void charls::jpeg_stream_writer::write_start_of_scan_segment(const int32_t, const int32_t, const interleave_mode)"
                 );
  }
  __assert_fail("near_lossless >= 0 && near_lossless <= numeric_limits<uint8_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.cpp"
                ,0xb0,
                "void charls::jpeg_stream_writer::write_start_of_scan_segment(const int32_t, const int32_t, const interleave_mode)"
               );
}

Assistant:

void jpeg_stream_writer::write_start_of_scan_segment(const int32_t component_count, const int32_t near_lossless,
                                                     const interleave_mode interleave_mode)
{
    ASSERT(component_count > 0 && component_count <= numeric_limits<uint8_t>::max());
    ASSERT(near_lossless >= 0 && near_lossless <= numeric_limits<uint8_t>::max());
    ASSERT(interleave_mode == interleave_mode::none || interleave_mode == interleave_mode::line ||
           interleave_mode == interleave_mode::sample);

    // Create a Scan Header as defined in T.87, C.2.3 and T.81, B.2.3
    write_segment_header(jpeg_marker_code::start_of_scan, 1 + (static_cast<size_t>(component_count) * 2) + 3);
    write_uint8(component_count);

    for (int32_t i{}; i != component_count; ++i)
    {
        write_uint8(component_id_);
        write_uint8(0); // Mapping table selector (0 = no table)
        ++component_id_;
    }

    write_uint8(near_lossless);                       // NEAR parameter
    write_uint8(to_underlying_type(interleave_mode)); // ILV parameter
    write_uint8(0);                                   // transformation
}